

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

void __thiscall
helics::NetworkCommsInterface::loadPortDefinitions(NetworkCommsInterface *this,ActionMessage *cmd)

{
  action_t aVar1;
  int iVar2;
  __int_type _Var3;
  int iVar4;
  ActionMessage *in_RSI;
  long *in_RDI;
  __int_type in_stack_ffffffffffffffc4;
  __atomic_base<int> *in_stack_ffffffffffffffc8;
  PortAllocator *this_00;
  
  aVar1 = ActionMessage::action(in_RSI);
  if ((aVar1 == cmd_protocol) && (in_RSI->messageID == 0x5ab)) {
    ActionMessage::getExtraData((ActionMessage *)0x401e39);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    iVar2 = PortAllocator::getDefaultStartingPort((PortAllocator *)(in_RDI + 0x85));
    if (iVar2 < 0) {
      _Var3 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffffc8);
      iVar2 = (**(code **)(*in_RDI + 0x50))();
      if (_Var3 < iVar2 + 100) {
        iVar2 = (**(code **)(*in_RDI + 0x50))();
        _Var3 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffffc8);
        iVar4 = (**(code **)(*in_RDI + 0x50))();
        PortAllocator::setStartingPortNumber
                  ((PortAllocator *)(in_RDI + 0x85),iVar2 + 100 + ((_Var3 - iVar4) + -2) * 6);
      }
      else {
        this_00 = (PortAllocator *)(in_RDI + 0x85);
        iVar2 = (**(code **)(*in_RDI + 0x50))();
        iVar2 = iVar2 + 0x6e;
        _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)this_00);
        iVar4 = (**(code **)(*in_RDI + 0x50))();
        PortAllocator::setStartingPortNumber(this_00,iVar2 + ((_Var3 - iVar4) + -100) * 6);
      }
    }
  }
  return;
}

Assistant:

void NetworkCommsInterface::loadPortDefinitions(const ActionMessage& cmd)
{
    if (cmd.action() == CMD_PROTOCOL) {
        if (cmd.messageID == PORT_DEFINITIONS) {
            PortNumber = cmd.getExtraData();
            if ((openPorts.getDefaultStartingPort() < 0)) {
                if (PortNumber < getDefaultBrokerPort() + 100) {
                    openPorts.setStartingPortNumber(getDefaultBrokerPort() + 100 +
                                                    (PortNumber - getDefaultBrokerPort() - 2) * 6);
                } else {
                    openPorts.setStartingPortNumber(getDefaultBrokerPort() + 110 +
                                                    (PortNumber - getDefaultBrokerPort() - 100) *
                                                        6);
                }
            }
        }
    }
}